

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTagType(BinaryReaderIR *this,Index index,Index sig_index)

{
  char *pcVar1;
  Offset OVar2;
  size_t sVar3;
  tuple<wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_> tVar4;
  Location loc;
  __uniq_ptr_impl<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> local_a0;
  Location local_98;
  Var local_78;
  
  pcVar1 = this->filename_;
  sVar3 = strlen(pcVar1);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  tVar4.super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
  super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>)
       operator_new(0x150);
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                  .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                  .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
          .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 0x18) = sVar3;
  *(char **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                   .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 0x20) =
       pcVar1;
  *(Offset *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
          .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 0x28) = OVar2;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                  .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
          .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 0x38) = 10;
  *(undefined ***)
   tVar4.super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
   super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl = &PTR__TagModuleField_002299c8
  ;
  Tag::Tag((Tag *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                         .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 0x40),
           (string_view)ZEXT816(0));
  local_98.field_1.field_0.line = 0;
  local_98.field_1.field_0.first_column = 0;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = 0;
  local_98.filename._M_str._0_4_ = 0;
  local_98.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_98.filename._M_len = strlen(pcVar1);
  local_98.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_98.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.line = (int)OVar2;
  local_98.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_78,sig_index,&local_98);
  SetFuncDeclaration(this,(FuncDeclaration *)
                          ((long)tVar4.
                                 super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                                 .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl
                          + 0x60),&local_78);
  Var::~Var(&local_78);
  local_a0._M_t.
  super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
  super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>)
       (tuple<wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>)
       tVar4.
       super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
       super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                       *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>)
      local_a0._M_t.
      super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>.
      super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl != (TagModuleField *)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::TagModuleField_*,_std::default_delete<wabt::TagModuleField>_>
                          .super__Head_base<0UL,_wabt::TagModuleField_*,_false>._M_head_impl + 8))()
    ;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTagType(Index index, Index sig_index) {
  auto field = std::make_unique<TagModuleField>(GetLocation());
  Tag& tag = field->tag;
  SetFuncDeclaration(&tag.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}